

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O0

void deqp::RobustBufferAccessBehavior::Program::Link(Functions *gl,GLuint id)

{
  glGetProgramInfoLogFunc p_Var1;
  undefined4 uVar2;
  GLint GVar3;
  GLenum GVar4;
  GLchar *pGVar5;
  TestError *this;
  char *message_00;
  string local_40 [8];
  string message;
  GLint local_18;
  GLint length;
  GLint status;
  GLuint id_local;
  Functions *gl_local;
  
  local_18 = 0;
  length = id;
  _status = gl;
  (*gl->linkProgram)(id);
  GVar4 = (*_status->getError)();
  glu::checkError(GVar4,"LinkProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x1b9);
  (*_status->getProgramiv)(length,0x8b82,&local_18);
  GVar4 = (*_status->getError)();
  glu::checkError(GVar4,"GetProgramiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x1bd);
  if (local_18 != 1) {
    message.field_2._12_4_ = 0;
    std::__cxx11::string::string(local_40);
    (*_status->getProgramiv)(length,0x8b84,(GLint *)(message.field_2._M_local_buf + 0xc));
    GVar4 = (*_status->getError)();
    glu::checkError(GVar4,"GetProgramiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x1c7);
    std::__cxx11::string::resize((ulong)local_40,(char)message.field_2._12_4_);
    GVar3 = length;
    uVar2 = message.field_2._12_4_;
    p_Var1 = _status->getProgramInfoLog;
    pGVar5 = (GLchar *)std::__cxx11::string::operator[]((ulong)local_40);
    (*p_Var1)(GVar3,uVar2,(GLsizei *)0x0,pGVar5);
    GVar4 = (*_status->getError)();
    glu::checkError(GVar4,"GetProgramInfoLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0x1cd);
    this = (TestError *)__cxa_allocate_exception(0x38);
    message_00 = (char *)std::__cxx11::string::c_str();
    tcu::TestError::TestError
              (this,message_00,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
               ,0x1cf);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void Program::Link(const glw::Functions& gl, glw::GLuint id)
{
	GLint status = GL_FALSE;

	gl.linkProgram(id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "LinkProgram");

	/* Get link status */
	gl.getProgramiv(id, GL_LINK_STATUS, &status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

	/* Log link error */
	if (GL_TRUE != status)
	{
		glw::GLint  length = 0;
		std::string message;

		/* Get error log length */
		gl.getProgramiv(id, GL_INFO_LOG_LENGTH, &length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramiv");

		message.resize(length, 0);

		/* Get error log */
		gl.getProgramInfoLog(id, length, 0, &message[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramInfoLog");

		TCU_FAIL(message.c_str());
	}
}